

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O3

void __thiscall Firework::explode(Firework *this)

{
  pointer *ppPVar1;
  iterator __position;
  double dVar2;
  Rng *this_00;
  int iVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_a0;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 aStack_98;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 aStack_90;
  undefined4 uStack_88;
  int iStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined1 local_68 [16];
  double local_50;
  undefined1 local_48 [16];
  
  this_00 = piksel::Rng::getInstance();
  piksel::Rng::random(this_00);
  piksel::Rng::random(this_00);
  piksel::Rng::random(this_00);
  iVar3 = 200;
  do {
    aStack_98 = (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    aStack_90 = (anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
    uStack_88 = 0;
    iStack_84 = 0xffffffff;
    local_80 = 0x3f8000003f800000;
    uStack_78 = 0x3f8000003f800000;
    local_70 = 0x3f800000;
    local_a0.field_0 =
         *(anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
           *)&(this->rocket).position.field_0;
    piksel::Rng::random(this_00);
    local_80 = CONCAT44(local_80._4_4_,extraout_XMM0_Da_02);
    piksel::Rng::random(this_00);
    local_68._0_4_ = extraout_XMM0_Da_03;
    piksel::Rng::random(this_00);
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = (double)extraout_XMM0_Da_04;
    local_48._12_4_ = extraout_XMM0_Dd;
    local_50 = (double)(float)local_68._0_4_;
    dVar2 = cos(local_50);
    local_68._8_4_ = extraout_XMM0_Dc_00;
    local_68._0_8_ = dVar2;
    local_68._12_4_ = extraout_XMM0_Dd_00;
    dVar2 = sin(local_50);
    aStack_98.field_0.y = (float)((double)local_48._0_8_ * dVar2);
    aStack_98.field_0.x = (float)((double)local_48._0_8_ * (double)local_68._0_8_);
    piksel::Rng::random(this_00);
    iStack_84 = (int)extraout_XMM0_Da_05;
    local_80 = CONCAT44(extraout_XMM0_Da,(undefined4)local_80);
    uStack_78 = CONCAT44(extraout_XMM0_Da_01,extraout_XMM0_Da_00);
    local_70 = 0x3f800000;
    __position._M_current =
         (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Particle,std::allocator<Particle>>::_M_realloc_insert<Particle_const&>
                ((vector<Particle,std::allocator<Particle>> *)&this->particles,__position,
                 (Particle *)&local_a0.field_0);
    }
    else {
      ((__position._M_current)->color).field_0.field_0.w = 1.0;
      *(undefined8 *)&(__position._M_current)->mass = local_80;
      *(undefined8 *)((long)&((__position._M_current)->color).field_0 + 4) = uStack_78;
      ((__position._M_current)->acceleration).field_0 = aStack_90;
      (__position._M_current)->age = uStack_88;
      (__position._M_current)->lifespan = iStack_84;
      ((__position._M_current)->position).field_0 = local_a0;
      ((__position._M_current)->velocity).field_0 = aStack_98;
      ppPVar1 = &(this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  this->exploded = true;
  return;
}

Assistant:

void Firework::explode() {
    piksel::Rng& rng = piksel::Rng::getInstance();
    glm::vec4 color = glm::vec4(rng.random(0.0f, 1.0f), rng.random(0.0f, 1.0f), rng.random(0.0f, 1.0f), 1.0f);
    for (int i = 0; i < 200; i++) {
        Particle particle;
        particle.position = rocket.position;
        particle.mass = rng.random(0.7, 1.0);
        float angle = rng.random(0.0, piksel::TWO_PI);
        float magnitude = rng.random(2.0f, 10.0f);
        particle.velocity = glm::vec2(magnitude * cos(angle), magnitude * sin(angle));
        particle.lifespan = rng.random(90.0f, 110.0f);
        particle.color = color;
        particles.push_back(particle);
    }
    exploded = true;
}